

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding-hash.cc
# Opt level: O1

void __thiscall
wabt::BindingHash::CreateDuplicatesVector(BindingHash *this,ValueTypeVector *out_duplicates)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  *ppVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  *ppVar2;
  iterator iVar3;
  bool bVar4;
  vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>
  *this_00;
  int iVar5;
  _Hash_node_base *p_Var6;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  bool bVar9;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  *local_40;
  vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>
  *local_38;
  
  p_Var7 = (this->
           super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
           )._M_h._M_before_begin._M_nxt;
  p_Var8 = p_Var7->_M_nxt;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    bVar4 = true;
    local_38 = (vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>
                *)out_duplicates;
    do {
      ppVar2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
                *)(p_Var7 + 1);
      ppVar1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
                *)(p_Var8 + 1);
      p_Var6 = p_Var7[2]._M_nxt;
      if (p_Var6 == p_Var8[2]._M_nxt) {
        if (p_Var6 == (_Hash_node_base *)0x0) {
          bVar9 = true;
        }
        else {
          iVar5 = bcmp((ppVar2->first)._M_dataplus._M_p,(ppVar1->first)._M_dataplus._M_p,
                       (size_t)p_Var6);
          bVar9 = iVar5 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      this_00 = local_38;
      p_Var6 = p_Var8;
      if (bVar9) {
        if (bVar4) {
          iVar3._M_current =
               *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
                 ***)(local_38 + 8);
          if (iVar3._M_current ==
              *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
                ***)(local_38 + 0x10)) {
            local_40 = ppVar2;
            std::
            vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>
            ::_M_realloc_insert<std::pair<std::__cxx11::string_const,wabt::Binding>const*>
                      (local_38,iVar3,&local_40);
          }
          else {
            *iVar3._M_current = ppVar2;
            *(long *)(local_38 + 8) = *(long *)(local_38 + 8) + 8;
          }
        }
        iVar3._M_current =
             *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
               ***)(this_00 + 8);
        p_Var6 = p_Var7;
        local_40 = ppVar1;
        if (iVar3._M_current ==
            *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
              ***)(this_00 + 0x10)) {
          std::
          vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>
          ::_M_realloc_insert<std::pair<std::__cxx11::string_const,wabt::Binding>const*>
                    (this_00,iVar3,&local_40);
        }
        else {
          *iVar3._M_current = ppVar1;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
      }
      bVar4 = (bool)(bVar9 ^ 1);
      p_Var8 = p_Var8->_M_nxt;
      p_Var7 = p_Var6;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void BindingHash::CreateDuplicatesVector(
    ValueTypeVector* out_duplicates) const {
  // This relies on the fact that in an unordered_multimap, all values with the
  // same key are adjacent in iteration order.
  auto first = begin();
  bool is_first = true;
  for (auto iter = std::next(first); iter != end(); ++iter) {
    if (first->first == iter->first) {
      if (is_first) {
        out_duplicates->push_back(&*first);
      }
      out_duplicates->push_back(&*iter);
      is_first = false;
    } else {
      is_first = true;
      first = iter;
    }
  }
}